

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress(void *dst,size_t dstSize,void *cSrc,size_t cSrcSize)

{
  U32 UVar1;
  ulong in_RCX;
  byte *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  U32 algoNb;
  size_t local_8;
  
  if (in_RSI == 0) {
    local_8 = 0xfffffffffffffffe;
  }
  else if (in_RSI < in_RCX) {
    local_8 = 0xfffffffffffffffc;
  }
  else {
    local_8 = in_RSI;
    if (in_RCX == in_RSI) {
      memcpy(in_RDI,in_RDX,in_RSI);
    }
    else if (in_RCX == 1) {
      memset(in_RDI,(uint)*in_RDX,in_RSI);
    }
    else {
      UVar1 = HUF_selectDecoder(in_RSI,in_RCX);
      local_8 = (*HUF_decompress::decompress[UVar1])(in_RDI,in_RSI,in_RDX,in_RCX);
    }
  }
  return local_8;
}

Assistant:

size_t HUF_decompress (void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize)
{
    static const decompressionAlgo decompress[2] = { HUF_decompress4X1, HUF_decompress4X2 };

    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
        return decompress[algoNb](dst, dstSize, cSrc, cSrcSize);
    }
}